

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::ConvertModel
          (FBXConverter *this,Model *model,aiNode *nd,aiMatrix4x4 *node_global_transform)

{
  uint uVar1;
  Geometry *pGVar2;
  pointer puVar3;
  MeshGeometry *mesh;
  LineGeometry *line;
  uint *__s;
  Model *model_00;
  ulong uVar4;
  _Alloc_hider _Var5;
  aiMatrix4x4 *in_R8;
  pointer ppGVar6;
  ulong uVar7;
  pointer puVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  FBXConverter *local_1e8;
  Model *local_1e0;
  aiMatrix4x4 *local_1d8;
  pointer local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  uint *local_1a8;
  uint *local_1a0;
  long local_198;
  ios_base local_138 [264];
  
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8 = this;
  local_1d8 = node_global_transform;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_208,
             (long)(model->geometry).
                   super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(model->geometry).
                   super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppGVar6 = (model->geometry).
            super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1d0 = (model->geometry).
              super__Vector_base<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_1e0 = model;
  if (ppGVar6 != local_1d0) {
    do {
      pGVar2 = *ppGVar6;
      if (pGVar2 == (Geometry *)0x0) {
LAB_005523ec:
        std::operator+(&local_1c8,"ignoring unrecognized geometry: ",&(pGVar2->super_Object).name);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1a8,
                   &local_1c8);
        LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          uVar4 = local_1c8.field_2._M_allocated_capacity + 1;
          _Var5._M_p = local_1c8._M_dataplus._M_p;
          goto LAB_00552448;
        }
      }
      else {
        mesh = (MeshGeometry *)__dynamic_cast(pGVar2,&Geometry::typeinfo,&MeshGeometry::typeinfo);
        model_00 = (Model *)0x0;
        line = (LineGeometry *)__dynamic_cast(pGVar2,&Geometry::typeinfo,&LineGeometry::typeinfo);
        if (mesh == (MeshGeometry *)0x0) {
          if (line == (LineGeometry *)0x0) goto LAB_005523ec;
          ConvertLine((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1a8,local_1e8,
                      line,model_00,in_R8,nd);
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (local_1a8,local_1a0,&local_208);
        }
        else {
          in_R8 = local_1d8;
          ConvertMesh((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1a8,local_1e8,
                      mesh,local_1e0,local_1d8,nd);
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<unsigned_int_const*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (local_1a8,local_1a0,&local_208);
        }
        if (local_1a8 != (uint *)0x0) {
          uVar4 = local_198 - (long)local_1a8;
          _Var5._M_p = (pointer)local_1a8;
LAB_00552448:
          operator_delete(_Var5._M_p,uVar4);
        }
      }
      ppGVar6 = ppGVar6 + 1;
    } while (ppGVar6 != local_1d0);
  }
  puVar3 = local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar8 = local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar7 = (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    uVar4 = -(ulong)(uVar7 >> 0x3e != 0) |
            (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    __s = (uint *)operator_new__(uVar4);
    memset(__s,0,uVar4);
    nd->mMeshes = __s;
    nd->mNumMeshes = (uint)uVar7;
    do {
      uVar1 = *puVar8;
      *puVar8 = *__s;
      *__s = uVar1;
      puVar8 = puVar8 + 1;
      __s = __s + 1;
    } while (puVar8 != puVar3);
  }
  if (local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FBXConverter::ConvertModel(const Model& model, aiNode& nd, const aiMatrix4x4& node_global_transform)
        {
            const std::vector<const Geometry*>& geos = model.GetGeometry();

            std::vector<unsigned int> meshes;
            meshes.reserve(geos.size());

            for (const Geometry* geo : geos) {

                const MeshGeometry* const mesh = dynamic_cast<const MeshGeometry*>(geo);
                const LineGeometry* const line = dynamic_cast<const LineGeometry*>(geo);
                if (mesh) {
                    const std::vector<unsigned int>& indices = ConvertMesh(*mesh, model, node_global_transform, nd);
                    std::copy(indices.begin(), indices.end(), std::back_inserter(meshes));
                }
                else if (line) {
                    const std::vector<unsigned int>& indices = ConvertLine(*line, model, node_global_transform, nd);
                    std::copy(indices.begin(), indices.end(), std::back_inserter(meshes));
                }
                else {
                    FBXImporter::LogWarn("ignoring unrecognized geometry: " + geo->Name());
                }
            }

            if (meshes.size()) {
                nd.mMeshes = new unsigned int[meshes.size()]();
                nd.mNumMeshes = static_cast<unsigned int>(meshes.size());

                std::swap_ranges(meshes.begin(), meshes.end(), nd.mMeshes);
            }
        }